

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

void Gia_ManPrintTents(Gia_Man_t *p)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  Gia_Man_t *p_00;
  int *piVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  Gia_Man_t *pGVar12;
  
  if (p->vCos->nSize <= p->nRegs) {
    __assert_fail("Gia_ManPoNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMan.c"
                  ,0x119,"void Gia_ManPrintTents(Gia_Man_t *)");
  }
  p_00 = (Gia_Man_t *)malloc(0x10);
  p_00->pName = (char *)0x64;
  piVar5 = (int *)malloc(400);
  p_00->pSpec = (char *)piVar5;
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x227,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  *p->pTravIds = p->nTravIds;
  pGVar12 = p_00;
  Vec_IntPush((Vec_Int_t *)p_00,0);
  uVar14 = *(int *)((long)&p_00->pName + 4);
  pVVar6 = p->vCos;
  uVar7 = (ulong)(uint)pVVar6->nSize;
  if (p->nRegs < pVVar6->nSize) {
    lVar15 = 0;
    do {
      if ((int)uVar7 <= lVar15) {
LAB_006ed8d8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = pVVar6->pArray[lVar15];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
LAB_006ed8b9:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar12 = p;
      Gia_ManPrintTents_rec(p,p->pObjs + iVar10,(Vec_Int_t *)p_00);
      lVar15 = lVar15 + 1;
      pVVar6 = p->vCos;
      uVar7 = (ulong)pVVar6->nSize;
    } while (lVar15 < (long)(uVar7 - (long)p->nRegs));
  }
  Abc_Print((int)pGVar12,"Tents:  ");
  iVar10 = (int)pGVar12;
  uVar8 = *(int *)((long)&p_00->pName + 4);
  if ((int)uVar14 < (int)uVar8) {
    uVar9 = 1;
    uVar4 = uVar8;
    do {
      uVar7 = (ulong)uVar14;
      uVar13 = 0;
      do {
        if (((int)uVar14 < 0) || (*(int *)((long)&p_00->pName + 4) <= (int)uVar7))
        goto LAB_006ed8d8;
        iVar10 = *(int *)((long)p_00->pSpec + uVar7 * 4);
        if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_006ed8b9;
        uVar2 = *(undefined8 *)(p->pObjs + iVar10);
        if ((~(uint)uVar2 & 0x9fffffff) == 0) {
          uVar8 = (uint)((ulong)uVar2 >> 0x20) & 0x1fffffff;
          iVar10 = p->vCis->nSize;
          uVar11 = iVar10 - p->nRegs;
          pGVar12 = (Gia_Man_t *)(ulong)uVar11;
          uVar13 = (ulong)((int)uVar13 + (uint)((int)uVar8 < (int)uVar11));
          if ((int)uVar11 <= (int)uVar8) {
            iVar1 = p->vCos->nSize;
            uVar8 = (iVar1 - iVar10) + uVar8;
            if (((int)uVar8 < 0) || (iVar1 <= (int)uVar8)) goto LAB_006ed8d8;
            uVar8 = p->vCos->pArray[uVar8];
            if (((long)(int)uVar8 < 0) || ((uint)p->nObjs <= uVar8)) goto LAB_006ed8b9;
            pGVar12 = p;
            Gia_ManPrintTents_rec(p,p->pObjs + (int)uVar8,(Vec_Int_t *)p_00);
          }
        }
        uVar7 = uVar7 + 1;
      } while ((int)uVar7 < (int)uVar4);
      Abc_Print((int)pGVar12,"%d=%d(%d)  ",(ulong)uVar9,(ulong)(uVar4 - uVar14),uVar13);
      iVar10 = (int)pGVar12;
      uVar9 = uVar9 + 1;
      uVar8 = *(int *)((long)&p_00->pName + 4);
      bVar3 = (int)uVar4 < (int)uVar8;
      uVar14 = uVar4;
      uVar4 = uVar8;
    } while (bVar3);
  }
  Abc_Print(iVar10," Unused=%d\n",(ulong)(p->nObjs - uVar8));
  if ((int *)p_00->pSpec != (int *)0x0) {
    free(p_00->pSpec);
  }
  free(p_00);
  return;
}

Assistant:

void Gia_ManPrintTents( Gia_Man_t * p )
{
    Vec_Int_t * vObjs;
    Gia_Obj_t * pObj;
    int t, i, iObjId, nSizePrev, nSizeCurr;
    assert( Gia_ManPoNum(p) > 0 );
    vObjs = Vec_IntAlloc( 100 );
    // save constant class
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Vec_IntPush( vObjs, 0 );
    // create starting root
    nSizePrev = Vec_IntSize(vObjs);
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManPrintTents_rec( p, pObj, vObjs );
    // build tents
    Abc_Print( 1, "Tents:  " );
    for ( t = 1; nSizePrev < Vec_IntSize(vObjs); t++ )
    {
        int nPis = 0;
        nSizeCurr = Vec_IntSize(vObjs);
        Vec_IntForEachEntryStartStop( vObjs, iObjId, i, nSizePrev, nSizeCurr )
        {
            nPis += Gia_ObjIsPi(p, Gia_ManObj(p, iObjId));
            if ( Gia_ObjIsRo(p, Gia_ManObj(p, iObjId)) )
                Gia_ManPrintTents_rec( p, Gia_ObjRoToRi(p, Gia_ManObj(p, iObjId)), vObjs );
        }
        Abc_Print( 1, "%d=%d(%d)  ", t, nSizeCurr - nSizePrev, nPis );
        nSizePrev = nSizeCurr;
    }
    Abc_Print( 1, " Unused=%d\n", Gia_ManObjNum(p) - Vec_IntSize(vObjs) );
    Vec_IntFree( vObjs );
    // the remaining objects are PIs without fanout
//    Gia_ManForEachObj( p, pObj, i )
//        if ( !Gia_ObjIsTravIdCurrent(p, pObj) )
//            Gia_ObjPrint( p, pObj );
}